

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O1

bool __thiscall
ggml::cpu::aarch64::tensor_traits<block_q4_0,_8L,_4L,_(ggml_type)8>::compute_forward
          (tensor_traits<block_q4_0,_8L,_4L,_(ggml_type)8> *this,ggml_compute_params *params,
          ggml_tensor *op)

{
  if (op->op == GGML_OP_MUL_MAT_ID) {
    forward_mul_mat_id(this,params,op);
  }
  else {
    if (op->op != GGML_OP_MUL_MAT) {
      return false;
    }
    forward_mul_mat(this,params,op);
  }
  return true;
}

Assistant:

bool compute_forward(struct ggml_compute_params * params, struct ggml_tensor * op) override {
        switch (op->op) {
            case GGML_OP_MUL_MAT:
                forward_mul_mat(params, op);
                return true;
            case GGML_OP_MUL_MAT_ID:
                forward_mul_mat_id(params, op);
                return true;
            default:
                // GGML_ABORT("fatal error");
                break;
        }
        return false;
    }